

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::Error(string *m)

{
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"CMake Error: ",m);
  s_ErrorOccured = true;
  Message(&local_28,"Error");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::Error(const std::string& m)
{
  std::string message = "CMake Error: " + m;
  cmSystemTools::s_ErrorOccured = true;
  cmSystemTools::Message(message, "Error");
}